

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::FileClassPrefix_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_00;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *this_01;
  size_t sVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  pointer pbVar4;
  bool bVar5;
  ostream *poVar6;
  pointer prVar7;
  AlphaNum *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar8;
  string_view usage;
  string_view input;
  string_view path;
  string_view path_00;
  allocator<char> local_152;
  allocator<char> local_151;
  iterator prefix_lookup;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140 [2];
  string result;
  string error_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segments;
  string_view objc_class_prefix;
  string local_90;
  AlphaNum local_70;
  SimpleLineCollector collector_1;
  
  pcVar3 = (anonymous_namespace)::g_prefix_mode;
  if ((*(byte *)(*(long *)(this + 0x80) + 0x28) & 8) == 0) {
    this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               *)((anonymous_namespace)::g_prefix_mode + 8);
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)this_00);
    if ((bVar5) && (*(long *)(pcVar3 + 0x30) != 0)) {
      error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
      error_str._M_string_length = 0;
      error_str.field_2._M_local_buf[0] = '\0';
      usage._M_str = "Package to prefixes";
      usage._M_len = 0x13;
      anon_unknown_0::PackageToPrefixesCollector::PackageToPrefixesCollector
                ((PackageToPrefixesCollector *)&prefix_lookup,usage,
                 (flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00);
      path._M_str = *(char **)(pcVar3 + 0x28);
      path._M_len = *(size_t *)(pcVar3 + 0x30);
      bVar5 = ParseSimpleFile(path,(LineConsumer *)&prefix_lookup,&error_str);
      if (!bVar5) {
        if (error_str._M_string_length == 0) {
          local_70.piece_ =
               absl::lts_20250127::NullSafeStringView("protoc:0: warning: Failed to parse ");
          result._0_16_ =
               absl::lts_20250127::NullSafeStringView("prefix to proto package mappings file: ");
          in_R8 = (AlphaNum *)&result;
          segments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(pcVar3 + 0x28);
          segments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(pcVar3 + 0x30);
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_90,(lts_20250127 *)&local_70,in_R8,(AlphaNum *)&segments,in_R8);
          std::__cxx11::string::operator=((string *)&error_str,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&error_str);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::ostream::flush();
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this_00);
      }
      anon_unknown_0::PackageToPrefixesCollector::~PackageToPrefixesCollector
                ((PackageToPrefixesCollector *)&prefix_lookup);
      std::__cxx11::string::~string((string *)&error_str);
    }
    segments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)**(undefined8 **)(this + 0x10);
    segments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(*(undefined8 **)(this + 0x10))[1];
    if (segments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      prefix_lookup.field_1.slot_ = (slot_type *)"no_package:";
      prefix_lookup.ctrl_ = &DAT_0000000b;
      local_70.piece_._M_str = (char *)**(undefined8 **)(this + 8);
      local_70.piece_._M_len = (*(undefined8 **)(this + 8))[1];
      absl::lts_20250127::StrCat_abi_cxx11_
                (&result,(lts_20250127 *)&prefix_lookup,&local_70,(AlphaNum *)local_70.piece_._M_str
                );
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&result,(basic_string_view<char,_std::char_traits<char>_> *)&segments,
                 (allocator<char> *)&error_str);
    }
    prefix_lookup =
         absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
         ::find<std::__cxx11::string>(this_00,&result);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this_00);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_70.piece_._M_str;
    local_70.piece_ = (string_view)(auVar2 << 0x40);
    bVar5 = absl::lts_20250127::container_internal::operator!=(&prefix_lookup,(iterator *)&local_70)
    ;
    if (bVar5) {
      prVar7 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::iterator::operator->(&prefix_lookup);
      objc_class_prefix._M_str = (prVar7->second)._M_dataplus._M_p;
      objc_class_prefix._M_len = (prVar7->second)._M_string_length;
    }
    else {
      objc_class_prefix._M_str = anon_var_dwarf_651463 + 5;
      objc_class_prefix._M_len = 0;
    }
    std::__cxx11::string::~string((string *)&result);
    pcVar3 = (anonymous_namespace)::g_prefix_mode;
    if (objc_class_prefix._M_len == 0) {
      if (*(anonymous_namespace)::g_prefix_mode == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,anon_var_dwarf_651463 + 5,
                   (allocator<char> *)&prefix_lookup);
      }
      else {
        local_90._M_string_length = **(size_type **)(this + 0x10);
        local_90._M_dataplus._M_p = (pointer)(*(size_type **)(this + 0x10))[1];
        this_01 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                   *)((anonymous_namespace)::g_prefix_mode + 0x88);
        bVar5 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_01);
        if ((bVar5) && (sVar1 = *(size_t *)(pcVar3 + 0x50), sVar1 != 0)) {
          prefix_lookup.field_1.slot_ = (slot_type *)0x0;
          prefix_lookup.ctrl_ = (ctrl_t *)local_140;
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (pcVar3 + 0x48);
          local_140[0]._M_local_buf[0] = '\0';
          collector_1.super_LineConsumer._vptr_LineConsumer =
               (_func_int **)&PTR__LineConsumer_0168ba78;
          path_00._M_str = (__rhs->_M_dataplus)._M_p;
          path_00._M_len = sVar1;
          collector_1.set_ =
               (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_01;
          bVar5 = ParseSimpleFile(path_00,&collector_1.super_LineConsumer,(string *)&prefix_lookup);
          if (!bVar5) {
            if (prefix_lookup.field_1.slot_ == (slot_type *)0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&segments,"protoc:0: warning: Failed to parse",&local_151);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&error_str," package prefix exceptions file: ",&local_152);
              std::operator+(&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&segments,&error_str);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_70,&result,__rhs);
              std::__cxx11::string::operator=((string *)&prefix_lookup,(string *)&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&result);
              std::__cxx11::string::~string((string *)&error_str);
              std::__cxx11::string::~string((string *)&segments);
            }
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&prefix_lookup);
            std::endl<char,std::char_traits<char>>(poVar6);
            std::ostream::flush();
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_01);
          }
          bVar5 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_01);
          if (bVar5) {
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace<const_char_(&)[21],_0>
                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                        *)&local_70,
                       (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_01,(char (*) [21])"<not a real package>");
          }
          std::__cxx11::string::~string((string *)&prefix_lookup);
        }
        bVar5 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                ::contains<std::basic_string_view<char,std::char_traits<char>>>
                          (this_01,(key_arg<std::basic_string_view<char>_> *)&local_90);
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,anon_var_dwarf_651463 + 5,
                     (allocator<char> *)&prefix_lookup);
        }
        else {
          result._M_string_length = 0;
          result._M_dataplus._M_p = (pointer)&result.field_2;
          result.field_2._M_local_buf[0] = '\0';
          prefix_lookup.field_1.slot_ =
               (*(anon_union_8_1_a8a14541_for_iterator_2 **)(this + 0x10))->slot_;
          prefix_lookup.ctrl_ =
               (ctrl_t *)(*(anon_union_8_1_a8a14541_for_iterator_2 **)(this + 0x10))[1].slot_;
          local_140[0]._M_local_buf[0] = '.';
          absl::lts_20250127::strings_internal::
          Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::
          operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                    (&segments,
                     (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      *)&prefix_lookup);
          pbVar4 = segments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar8 = segments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar4;
              pbVar8 = pbVar8 + 1) {
            input._M_str = (char *)0x1;
            input._M_len = (size_t)(pbVar8->_M_dataplus)._M_p;
            (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                      ((string *)&prefix_lookup,(_anonymous_namespace_ *)pbVar8->_M_string_length,
                       input,SUB81(in_R8,0));
            if (prefix_lookup.field_1.slot_ != (slot_type *)0x0) {
              if (result._M_string_length != 0) {
                std::__cxx11::string::append((char *)&result);
              }
              std::__cxx11::string::append((string *)&result);
            }
            std::__cxx11::string::~string((string *)&prefix_lookup);
          }
          if (result._M_string_length == 0) {
            local_70.piece_._M_len = 0;
          }
          else {
            std::__cxx11::string::append((char *)&result);
            local_70.piece_._M_len = result._M_string_length;
          }
          prefix_lookup.field_1 =
               (anon_union_8_1_a8a14541_for_iterator_2)
               (anon_union_8_1_a8a14541_for_iterator_2)
               ((anon_union_8_1_a8a14541_for_iterator_2 *)
               ((anonymous_namespace)::g_prefix_mode + 0x68))->slot_;
          prefix_lookup.ctrl_ = *(ctrl_t **)((anonymous_namespace)::g_prefix_mode + 0x70);
          local_70.piece_._M_str = result._M_dataplus._M_p;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (__return_storage_ptr__,(lts_20250127 *)&prefix_lookup,&local_70,
                     (AlphaNum *)result._M_dataplus._M_p);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&segments);
          std::__cxx11::string::~string((string *)&result);
        }
      }
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&objc_class_prefix,
                 (allocator<char> *)&prefix_lookup);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)(*(ulong *)(*(long *)(this + 0x80) + 0x60) & 0xfffffffffffffffc));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileClassPrefix(const FileDescriptor* file) {
  // Always honor the file option.
  if (file->options().has_objc_class_prefix()) {
    return file->options().objc_class_prefix();
  }

  // If package prefix is specified in an prefix to proto mappings file then use
  // that.
  absl::string_view objc_class_prefix =
      g_prefix_mode.prefix_from_proto_package_mappings(file);
  if (!objc_class_prefix.empty()) {
    return std::string(objc_class_prefix);
  }

  // If package prefix isn't enabled, done.
  if (!g_prefix_mode.use_package_name()) {
    return "";
  }

  // If the package is in the exceptions list, done.
  if (g_prefix_mode.is_package_exempted(file->package())) {
    return "";
  }

  // Transform the package into a prefix: use the dot segments as part,
  // camelcase each one and then join them with underscores, and add an
  // underscore at the end.
  std::string result;
  const std::vector<std::string> segments =
      absl::StrSplit(file->package(), '.', absl::SkipEmpty());
  for (const auto& segment : segments) {
    const std::string part = UnderscoresToCamelCase(segment, true);
    if (part.empty()) {
      continue;
    }
    if (!result.empty()) {
      result.append("_");
    }
    result.append(part);
  }
  if (!result.empty()) {
    result.append("_");
  }
  return absl::StrCat(g_prefix_mode.forced_package_prefix(), result);
}